

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

UBool __thiscall
icu_63::UnicodeString::endsWith(UnicodeString *this,ConstChar16Ptr *srcChars,int32_t srcLength)

{
  int8_t iVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  UChar *s;
  undefined4 local_1c;
  int32_t srcLength_local;
  ConstChar16Ptr *srcChars_local;
  UnicodeString *this_local;
  
  local_1c = srcLength;
  if (srcLength < 0) {
    pcVar3 = ConstChar16Ptr::operator_cast_to_char16_t_(srcChars);
    s = toUCharPtr(pcVar3);
    local_1c = u_strlen_63(s);
  }
  iVar2 = length(this);
  pcVar3 = ConstChar16Ptr::operator_cast_to_char16_t_(srcChars);
  iVar1 = doCompare(this,iVar2 - local_1c,local_1c,pcVar3,0,local_1c);
  return iVar1 == '\0';
}

Assistant:

inline UBool
UnicodeString::endsWith(ConstChar16Ptr srcChars,
            int32_t srcLength) const {
  if(srcLength < 0) {
    srcLength = u_strlen(toUCharPtr(srcChars));
  }
  return doCompare(length() - srcLength, srcLength,
                   srcChars, 0, srcLength) == 0;
}